

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffhist(fitsfile **fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],double *minin,
          double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
          char (*binname) [71],double weightin,char *wtcol,int recip,char *selectrow,int *status)

{
  double *pdVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int in_ECX;
  int in_EDX;
  long *in_RDI;
  char *in_R8;
  long in_R9;
  double in_XMM0_Qa;
  double dVar5;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  char *in_stack_00000030;
  int *in_stack_00000048;
  char *cptr;
  char cpref [4] [71];
  double dvalue;
  char svalue [71];
  double datamax;
  double datamin;
  double maxbin [4];
  double binsize [4];
  double amax [4];
  double amin [4];
  histType histData;
  long n_per_loop;
  long offset;
  int nkeys;
  int n_cols;
  iteratorCol imagepars [1];
  tcolumn *colptr;
  char card [81];
  char keyname [75];
  char errmsg [81];
  fitsfile *histptr;
  long haxes [4];
  int use_datamax;
  int tstatus;
  int bitpix;
  int ibin;
  int imax;
  int imin;
  int repeat;
  int datatype;
  int ii;
  int *in_stack_00001918;
  double *in_stack_00001920;
  double *in_stack_00001928;
  int in_stack_00001934;
  fitsfile *in_stack_00001938;
  int *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  int in_stack_fffffffffffff984;
  fitsfile *in_stack_fffffffffffff988;
  char *pcVar6;
  long *in_stack_fffffffffffff990;
  long *in_stack_fffffffffffff998;
  int *in_stack_fffffffffffff9a0;
  fitsfile *in_stack_fffffffffffff9a8;
  fitsfile *in_stack_fffffffffffff9b0;
  fitsfile *in_stack_fffffffffffff9b8;
  int *in_stack_fffffffffffff9c0;
  int *in_stack_fffffffffffff9c8;
  int *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined1 in_stack_fffffffffffff9dc;
  undefined1 in_stack_fffffffffffff9dd;
  undefined1 in_stack_fffffffffffff9de;
  undefined1 in_stack_fffffffffffff9df;
  fitsfile *in_stack_fffffffffffff9e0;
  int *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f4;
  fitsfile *in_stack_fffffffffffff9f8;
  fitsfile local_5d1 [4];
  fitsfile local_58a [4];
  char acStack_543 [83];
  double local_4f0;
  double local_498;
  undefined8 local_490;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *local_488;
  long local_480;
  long local_478;
  iteratorCol *local_470;
  double local_468 [3];
  int *local_450;
  double local_448 [4];
  double local_428 [3];
  void *local_410;
  long local_3f8;
  int local_3f0;
  int local_3ec [4];
  int local_3dc;
  long local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  double local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  void *in_stack_fffffffffffffc60;
  long in_stack_fffffffffffffc70;
  long in_stack_fffffffffffffc78;
  iteratorCol *in_stack_fffffffffffffc80;
  int *in_stack_fffffffffffffca0;
  double local_320;
  int local_2c0;
  char *in_stack_fffffffffffffd78;
  char local_198 [97];
  undefined1 local_137;
  char local_e8 [88];
  fitsfile *local_90;
  long local_88 [5];
  int local_5c;
  int local_58;
  undefined4 local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  long local_30;
  char *local_28;
  int local_20;
  int local_1c;
  long *local_10;
  int local_4;
  
  local_5c = 0;
  local_490 = 0xb8a83e285ebab4b7;
  local_498 = -9.1191291391491e-36;
  if (*in_stack_00000048 < 1) {
    if (in_ECX < 5) {
      local_38 = in_XMM0_Qa;
      local_30 = in_R9;
      local_28 = in_R8;
      local_20 = in_ECX;
      local_1c = in_EDX;
      local_10 = in_RDI;
      if (*(int *)*in_RDI != *(int *)(*(long *)(*in_RDI + 8) + 0x54)) {
        ffmahd(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,in_stack_fffffffffffff9e8,
               &in_stack_fffffffffffff9e0->HDUposition);
      }
      local_3f8 = *local_10;
      local_3dc = local_1c;
      local_3f0 = local_20;
      if (local_1c == 0xb) {
        local_54 = 8;
      }
      else if (local_1c == 0x15) {
        local_54 = 0x10;
      }
      else if (local_1c == 0x1f) {
        local_54 = 0x20;
      }
      else if (local_1c == 0x2a) {
        local_54 = 0xffffffe0;
      }
      else {
        if (local_1c != 0x52) {
          *in_stack_00000048 = 0x19a;
          return 0x19a;
        }
        local_54 = 0xffffffc0;
      }
      local_58 = 0;
      ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
            (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
            (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
      if (local_58 == 0) {
        in_stack_fffffffffffff9e0 = (fitsfile *)&stack0xfffffffffffff9e8;
        while( true ) {
          in_stack_fffffffffffff9df = false;
          if ((char)in_stack_fffffffffffff9e0->HDUposition != ',') {
            in_stack_fffffffffffff9df = (char)in_stack_fffffffffffff9e0->HDUposition != '\0';
          }
          if ((bool)in_stack_fffffffffffff9df == false) break;
          in_stack_fffffffffffff9e0 =
               (fitsfile *)((long)&in_stack_fffffffffffff9e0->HDUposition + 1);
        }
        if ((char)in_stack_fffffffffffff9e0->HDUposition != '\0') {
          *(undefined1 *)&in_stack_fffffffffffff9e0->HDUposition = 0;
          do {
            in_stack_fffffffffffff9e0 =
                 (fitsfile *)((long)&in_stack_fffffffffffff9e0->HDUposition + 1);
          } while ((char)in_stack_fffffffffffff9e0->HDUposition == ' ');
          strcpy((char *)local_5d1,(char *)in_stack_fffffffffffff9e0);
          in_stack_fffffffffffff9e0 = local_5d1;
          while( true ) {
            in_stack_fffffffffffff9de = false;
            if ((char)in_stack_fffffffffffff9e0->HDUposition != ',') {
              in_stack_fffffffffffff9de = (char)in_stack_fffffffffffff9e0->HDUposition != '\0';
            }
            if ((bool)in_stack_fffffffffffff9de == false) break;
            in_stack_fffffffffffff9e0 =
                 (fitsfile *)((long)&in_stack_fffffffffffff9e0->HDUposition + 1);
          }
          if ((char)in_stack_fffffffffffff9e0->HDUposition != '\0') {
            *(undefined1 *)&in_stack_fffffffffffff9e0->HDUposition = 0;
            do {
              in_stack_fffffffffffff9e0 =
                   (fitsfile *)((long)&in_stack_fffffffffffff9e0->HDUposition + 1);
            } while ((char)in_stack_fffffffffffff9e0->HDUposition == ' ');
            strcpy((char *)local_58a,(char *)in_stack_fffffffffffff9e0);
            in_stack_fffffffffffff9e0 = local_58a;
            while( true ) {
              in_stack_fffffffffffff9dd = false;
              if ((char)in_stack_fffffffffffff9e0->HDUposition != ',') {
                in_stack_fffffffffffff9dd = (char)in_stack_fffffffffffff9e0->HDUposition != '\0';
              }
              if ((bool)in_stack_fffffffffffff9dd == false) break;
              in_stack_fffffffffffff9e0 =
                   (fitsfile *)((long)&in_stack_fffffffffffff9e0->HDUposition + 1);
            }
            if ((char)in_stack_fffffffffffff9e0->HDUposition != '\0') {
              *(undefined1 *)&in_stack_fffffffffffff9e0->HDUposition = 0;
              do {
                in_stack_fffffffffffff9e0 =
                     (fitsfile *)((long)&in_stack_fffffffffffff9e0->HDUposition + 1);
              } while ((char)in_stack_fffffffffffff9e0->HDUposition == ' ');
              strcpy(acStack_543,(char *)in_stack_fffffffffffff9e0);
            }
          }
        }
      }
      for (local_3c = 0; iVar2 = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
          local_3c < local_20; local_3c = local_3c + 1) {
        if ((*(char *)(in_stack_00000018 + (long)local_3c * 0x47) != '\0') &&
           (iVar2 = ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                          in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                          (int *)in_stack_fffffffffffff990), iVar2 != 0)) {
          ffpmsg((char *)0x1de95d);
          ffpmsg((char *)0x1de979);
          return *in_stack_00000048;
        }
        if ((*(char *)(in_stack_00000020 + (long)local_3c * 0x47) != '\0') &&
           (iVar2 = ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                          (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                          (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990),
           iVar2 != 0)) {
          ffpmsg((char *)0x1dea12);
          ffpmsg((char *)0x1dea2e);
          return *in_stack_00000048;
        }
        if ((*(char *)(in_stack_00000028 + (long)local_3c * 0x47) != '\0') &&
           (iVar2 = ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                          (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                          (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990),
           iVar2 != 0)) {
          ffpmsg((char *)0x1deac7);
          ffpmsg((char *)0x1deae3);
          return *in_stack_00000048;
        }
        dVar5 = *(double *)(in_stack_00000010 + (long)local_3c * 8);
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          ffpmsg((char *)0x1deb27);
          *in_stack_00000048 = 0x142;
          return 0x142;
        }
        if ((local_28[(long)local_3c * 0x47] == '\0') &&
           (strcpy(local_28 + (long)local_3c * 0x47,&stack0xfffffffffffff9e8 + (long)local_3c * 0x47
                  ), local_28[(long)local_3c * 0x47] == '\0')) {
          if (local_3c == 0) {
            strcpy(local_28,"X");
          }
          else if (local_3c == 1) {
            strcpy(local_28 + 0x47,"Y");
          }
          else if (local_3c == 2) {
            strcpy(local_28 + 0x8e,"Z");
          }
          else if (local_3c == 3) {
            strcpy(local_28 + 0xd5,"T");
          }
        }
        iVar2 = ffgcno(in_stack_fffffffffffff9e0,
                       CONCAT13(in_stack_fffffffffffff9df,
                                CONCAT12(in_stack_fffffffffffff9de,
                                         CONCAT11(in_stack_fffffffffffff9dd,
                                                  in_stack_fffffffffffff9dc))),
                       (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                       in_stack_fffffffffffff9c0);
        if (0 < iVar2) {
          strcpy(local_e8,"column for histogram axis doesn\'t exist: ");
          pcVar6 = local_e8;
          pcVar3 = local_28 + (long)local_3c * 0x47;
          sVar4 = strlen(local_e8);
          strncat(pcVar6,pcVar3,0x50 - sVar4);
          ffpmsg((char *)0x1ded49);
          return *in_stack_00000048;
        }
        local_44 = (int)*(undefined8 *)
                         (*(long *)(*(long *)(*local_10 + 8) + 0x3d0) +
                          (long)(local_3ec[local_3c] + -1) * 0xa0 + 0x58);
        if (1 < local_44) {
          strcpy(local_e8,"Can\'t bin a vector column: ");
          pcVar6 = local_e8;
          pcVar3 = local_28 + (long)local_3c * 0x47;
          sVar4 = strlen(local_e8);
          strncat(pcVar6,pcVar3,0x50 - sVar4);
          ffpmsg((char *)0x1dee3f);
          *in_stack_00000048 = 0x19a;
          return 0x19a;
        }
        ffeqty(in_stack_fffffffffffff9b0,(int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
               in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,in_stack_fffffffffffff990,
               &in_stack_fffffffffffff988->HDUposition);
        if ((local_40 < 0) || (local_40 == 0x10)) {
          strcpy(local_e8,"Inappropriate datatype; can\'t bin this column: ");
          pcVar6 = local_e8;
          pcVar3 = local_28 + (long)local_3c * 0x47;
          sVar4 = strlen(local_e8);
          strncat(pcVar6,pcVar3,0x50 - sVar4);
          ffpmsg((char *)0x1def1e);
          *in_stack_00000048 = 0x19a;
          return 0x19a;
        }
        dVar5 = *(double *)(local_30 + (long)local_3c * 8);
        if ((dVar5 != -9.1191291391491e-36) || (NAN(dVar5))) {
          local_428[local_3c] = *(double *)(local_30 + (long)local_3c * 8);
        }
        else {
          ffkeyn((char *)in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                 (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
          iVar2 = ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                        (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                        (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
          if (0 < iVar2) {
            *in_stack_00000048 = 0;
            iVar2 = fits_get_col_minmax(in_stack_00001938,in_stack_00001934,in_stack_00001928,
                                        in_stack_00001920,in_stack_00001918);
            if (0 < iVar2) {
              strcpy(local_e8,"Error calculating datamin and datamax for column: ");
              pcVar6 = local_e8;
              pcVar3 = local_28 + (long)local_3c * 0x47;
              sVar4 = strlen(local_e8);
              strncat(pcVar6,pcVar3,0x50 - sVar4);
              ffpmsg((char *)0x1df0ad);
              return *in_stack_00000048;
            }
          }
        }
        dVar5 = *(double *)(in_stack_00000008 + (long)local_3c * 8);
        if ((dVar5 != -9.1191291391491e-36) || (NAN(dVar5))) {
          local_448[local_3c] = *(double *)(in_stack_00000008 + (long)local_3c * 8);
        }
        else {
          ffkeyn((char *)in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                 (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
          iVar2 = ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                        (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                        (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
          if (0 < iVar2) {
            *in_stack_00000048 = 0;
            if ((local_498 != -9.1191291391491e-36) || (NAN(local_498))) {
              local_448[local_3c] = local_498;
            }
            else {
              iVar2 = fits_get_col_minmax(in_stack_00001938,in_stack_00001934,in_stack_00001928,
                                          in_stack_00001920,in_stack_00001918);
              if (0 < iVar2) {
                strcpy(local_e8,"Error calculating datamin and datamax for column: ");
                pcVar6 = local_e8;
                pcVar3 = local_28 + (long)local_3c * 0x47;
                sVar4 = strlen(local_e8);
                strncat(pcVar6,pcVar3,0x50 - sVar4);
                ffpmsg((char *)0x1df298);
                return *in_stack_00000048;
              }
            }
          }
          local_5c = 1;
        }
        dVar5 = *(double *)(in_stack_00000010 + (long)local_3c * 8);
        if ((dVar5 == -9.1191291391491e-36) && (!NAN(dVar5))) {
          local_58 = 0;
          ffkeyn((char *)in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                 (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
          iVar2 = ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                        (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                        (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
          if ((0 < iVar2) &&
             (*(double *)(in_stack_00000010 + (long)local_3c * 8) =
                   (local_448[local_3c] - local_428[local_3c]) / 10.0,
             1.0 < *(double *)(in_stack_00000010 + (long)local_3c * 8))) {
            *(undefined8 *)(in_stack_00000010 + (long)local_3c * 8) = 0x3ff0000000000000;
          }
        }
        if (((local_448[local_3c] <= local_428[local_3c] &&
              local_428[local_3c] != local_448[local_3c]) &&
            (0.0 < *(double *)(in_stack_00000010 + (long)local_3c * 8))) ||
           ((local_428[local_3c] < local_448[local_3c] &&
            (pdVar1 = (double *)(in_stack_00000010 + (long)local_3c * 8),
            *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) {
          local_468[local_3c] = -*(double *)(in_stack_00000010 + (long)local_3c * 8);
        }
        else {
          local_468[local_3c] = *(double *)(in_stack_00000010 + (long)local_3c * 8);
        }
        local_50 = (int)local_468[local_3c];
        local_48 = (int)local_428[local_3c];
        local_4c = (int)local_448[local_3c];
        if (((((0x29 < local_40) || ((double)local_48 != local_428[local_3c])) ||
             (NAN((double)local_48) || NAN(local_428[local_3c]))) ||
            (((double)local_4c != local_448[local_3c] ||
             (NAN((double)local_4c) || NAN(local_448[local_3c]))))) ||
           (((double)local_50 != local_468[local_3c] ||
            (NAN((double)local_50) || NAN(local_468[local_3c]))))) {
          if (local_5c == 0) {
            (&local_488)[local_3c] =
                 (_func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *)
                 ((local_448[local_3c] - local_428[local_3c]) / local_468[local_3c]);
            local_88[local_3c] = (long)(double)(&local_488)[local_3c];
            if (local_448[local_3c] <= local_428[local_3c]) {
              dVar5 = (double)local_88[local_3c] * local_468[local_3c] + local_428[local_3c];
              if (local_448[local_3c] <= dVar5 && dVar5 != local_448[local_3c]) {
                local_88[local_3c] = local_88[local_3c] + 1;
              }
            }
            else if ((double)local_88[local_3c] * local_468[local_3c] + local_428[local_3c] <
                     local_448[local_3c]) {
              local_88[local_3c] = local_88[local_3c] + 1;
            }
          }
          else {
            (&local_488)[local_3c] =
                 (_func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *)
                 ((local_448[local_3c] - local_428[local_3c]) / local_468[local_3c]);
            local_88[local_3c] = (long)((double)(&local_488)[local_3c] + 1.0);
          }
        }
        else {
          local_88[local_3c] = (long)((local_4c - local_48) / local_50 + 1);
          (&local_488)[local_3c] =
               (_func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *)
               ((double)local_88[local_3c] + 1.0);
          if (local_448[local_3c] <= local_428[local_3c]) {
            local_428[local_3c] = local_428[local_3c] + 0.5;
            local_448[local_3c] = local_448[local_3c] - 0.5;
          }
          else {
            local_428[local_3c] = local_428[local_3c] - 0.5;
            local_448[local_3c] = local_448[local_3c] + 0.5;
          }
        }
      }
      if (*in_stack_00000030 == '\0') {
        local_320 = local_38;
      }
      else {
        iVar2 = ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
        if (iVar2 != 0) {
          *in_stack_00000048 = 0;
          iVar2 = ffgcno(in_stack_fffffffffffff9e0,
                         CONCAT13(in_stack_fffffffffffff9df,
                                  CONCAT12(in_stack_fffffffffffff9de,
                                           CONCAT11(in_stack_fffffffffffff9dd,
                                                    in_stack_fffffffffffff9dc))),
                         (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                         in_stack_fffffffffffff9c0);
          if (0 < iVar2) {
            ffpmsg((char *)0x1df9b0);
            ffpmsg((char *)0x1df9bd);
            return *in_stack_00000048;
          }
          local_320 = -9.1191291391491e-36;
        }
      }
      if ((0.0 < local_320) || ((local_320 == -9.1191291391491e-36 && (!NAN(local_320))))) {
        iVar2 = ffinit((fitsfile **)binsize[3],(char *)binsize[2],(int *)binsize[1]);
        if (iVar2 < 1) {
          iVar2 = ffcrim(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
                         (int)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                         (int *)in_stack_fffffffffffff990);
          if (iVar2 < 1) {
            ffghsp(in_stack_fffffffffffff988,
                   (int *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                   in_stack_fffffffffffff978,(int *)0x1dfb67);
            for (local_3c = 1; local_3c <= local_2c0; local_3c = local_3c + 1) {
              ffgrec(in_stack_fffffffffffff988,in_stack_fffffffffffff984,
                     (char *)in_stack_fffffffffffff978,(int *)0x1dfba9);
              iVar2 = ffgkcl(in_stack_fffffffffffffd78);
              if (0x77 < iVar2) {
                ffprec(in_stack_fffffffffffff9f8,
                       (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                       in_stack_fffffffffffff9e8);
              }
            }
            local_3b8 = local_428[0];
            local_3d8 = local_88[0];
            if (1 < local_3f0) {
              local_3b0 = local_428[1];
              local_3d0 = local_88[1];
              in_stack_fffffffffffffc70 = local_480;
              if (2 < local_3f0) {
                local_3a8 = local_428[2];
                local_3c8 = local_88[2];
                in_stack_fffffffffffffc78 = local_478;
                if (3 < local_3f0) {
                  local_3c0 = local_88[3];
                  in_stack_fffffffffffffc60 = local_410;
                  in_stack_fffffffffffffc80 = local_470;
                  in_stack_fffffffffffffca0 = local_450;
                }
              }
            }
            dVar5 = local_468[0];
            fits_iter_set_file((iteratorCol *)&stack0xfffffffffffffd48,local_90);
            iVar2 = SUB84(dVar5,0);
            fits_iter_set_datatype((iteratorCol *)&stack0xfffffffffffffd48,local_1c);
            fits_iter_set_iotype((iteratorCol *)&stack0xfffffffffffffd48,2);
            iVar2 = ffiter(iVar2,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                           in_stack_fffffffffffffc70,local_488,in_stack_fffffffffffffc60,
                           in_stack_fffffffffffffca0);
            if (iVar2 == 0) {
              for (local_3c = 0; iVar2 = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                  local_3c < local_3f0; local_3c = local_3c + 1) {
                local_58 = 0;
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                      (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                      (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                if (local_58 != 0) {
                  local_58 = 0;
                  ffkeyn((char *)in_stack_fffffffffffff9b8,
                         (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                         (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                  ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                        (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                        (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                }
                if (local_58 == 0) {
                  ffkeyn((char *)in_stack_fffffffffffff9b8,
                         (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                         (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                else {
                  local_58 = 0;
                }
                ffkeyn((char *)in_stack_fffffffffffff9b8,
                       (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                       (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                      (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                      (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                if (local_58 != 0) {
                  local_58 = 0;
                  ffkeyn((char *)in_stack_fffffffffffff9b8,
                         (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                         (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                  ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                        (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                        (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                }
                if (local_58 == 0) {
                  ffkeyn((char *)in_stack_fffffffffffff9b8,
                         (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                         (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                else {
                  local_58 = 0;
                }
                ffkeyn((char *)in_stack_fffffffffffff9b8,
                       (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                       (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                      (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                      (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  local_4f0 = (local_4f0 - local_428[local_3c]) / local_468[local_3c] + 0.5;
                }
                else {
                  local_4f0 = 1.0;
                  local_58 = 0;
                }
                ffkeyn((char *)in_stack_fffffffffffff9b8,
                       (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                       (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                      (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                      (char *)CONCAT17(in_stack_fffffffffffff9df,
                                       CONCAT16(in_stack_fffffffffffff9de,
                                                CONCAT15(in_stack_fffffffffffff9dd,
                                                         CONCAT14(in_stack_fffffffffffff9dc,
                                                                  in_stack_fffffffffffff9d8)))),
                      in_stack_fffffffffffff9d0);
                ffkeyn((char *)in_stack_fffffffffffff9b8,
                       (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                       (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                      (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                      (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                if (local_58 != 0) {
                  local_4f0 = local_428[local_3c] + local_468[local_3c] / 2.0;
                  local_58 = 0;
                }
                ffkeyn((char *)in_stack_fffffffffffff9b8,
                       (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                       (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                      (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                      (char *)CONCAT17(in_stack_fffffffffffff9df,
                                       CONCAT16(in_stack_fffffffffffff9de,
                                                CONCAT15(in_stack_fffffffffffff9dd,
                                                         CONCAT14(in_stack_fffffffffffff9dc,
                                                                  in_stack_fffffffffffff9d8)))),
                      in_stack_fffffffffffff9d0);
                ffkeyn((char *)in_stack_fffffffffffff9b8,
                       (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                       (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                      (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                      (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                if (local_58 != 0) {
                  local_4f0 = 1.0;
                  local_58 = 0;
                }
                local_4f0 = local_4f0 * local_468[local_3c];
                ffkeyn((char *)in_stack_fffffffffffff9b8,
                       (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                       (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                      (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                      (char *)CONCAT17(in_stack_fffffffffffff9df,
                                       CONCAT16(in_stack_fffffffffffff9de,
                                                CONCAT15(in_stack_fffffffffffff9dd,
                                                         CONCAT14(in_stack_fffffffffffff9dc,
                                                                  in_stack_fffffffffffff9d8)))),
                      in_stack_fffffffffffff9d0);
                if (local_3c == 1) {
                  ffkeyn((char *)in_stack_fffffffffffff9b8,
                         (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                         (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                  ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                        (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                        (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                  iVar2 = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
                  if ((local_58 == 0) && ((local_4f0 != 0.0 || (NAN(local_4f0))))) {
                    ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8
                           ,in_stack_fffffffffffff9a0);
                    ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                          (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                          (char *)CONCAT17(in_stack_fffffffffffff9df,
                                           CONCAT16(in_stack_fffffffffffff9de,
                                                    CONCAT15(in_stack_fffffffffffff9dd,
                                                             CONCAT14(in_stack_fffffffffffff9dc,
                                                                      in_stack_fffffffffffff9d8)))),
                          in_stack_fffffffffffff9d0);
                  }
                  else {
                    local_58 = 0;
                    ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8
                           ,in_stack_fffffffffffff9a0);
                    ffgky(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                          (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                          (char *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
                    if ((local_58 == 0) && ((local_4f0 != 0.0 || (NAN(local_4f0))))) {
                      local_4f0 = local_4f0 * -1.0;
                      ffkeyn((char *)in_stack_fffffffffffff9b8,
                             (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),
                             (char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                      ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                            (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                            (char *)CONCAT17(in_stack_fffffffffffff9df,
                                             CONCAT16(in_stack_fffffffffffff9de,
                                                      CONCAT15(in_stack_fffffffffffff9dd,
                                                               CONCAT14(in_stack_fffffffffffff9dc,
                                                                        in_stack_fffffffffffff9d8)))
                                            ),in_stack_fffffffffffff9d0);
                    }
                  }
                }
              }
              if (local_3f0 == 2) {
                local_58 = 0;
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                strcat(local_198,"_");
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                local_58 = 0;
                local_137 = 0x43;
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  local_4f0 = local_468[0] * local_4f0;
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                local_58 = 0;
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                strcat(local_198,"_");
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                local_58 = 0;
                local_137 = 0x43;
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  local_4f0 = local_468[0] * local_4f0;
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                local_58 = 0;
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                strcat(local_198,"_");
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                local_58 = 0;
                local_137 = 0x43;
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  local_4f0 = local_468[1] * local_4f0;
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                local_58 = 0;
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                strcat(local_198,"_");
                ffkeyn((char *)in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9a0);
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
                local_58 = 0;
                local_137 = 0x43;
                ffgky(in_stack_fffffffffffff9b8,iVar2,(char *)in_stack_fffffffffffff9a8,
                      in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,
                      (int *)in_stack_fffffffffffff990);
                if (local_58 == 0) {
                  local_4f0 = local_468[1] * local_4f0;
                  ffpky(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                        (char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                        (char *)CONCAT17(in_stack_fffffffffffff9df,
                                         CONCAT16(in_stack_fffffffffffff9de,
                                                  CONCAT15(in_stack_fffffffffffff9dd,
                                                           CONCAT14(in_stack_fffffffffffff9dc,
                                                                    in_stack_fffffffffffff9d8)))),
                        in_stack_fffffffffffff9d0);
                }
              }
              ffclos(in_stack_fffffffffffff988,
                     (int *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
              *local_10 = (long)local_90;
              local_4 = *in_stack_00000048;
            }
            else {
              local_4 = *in_stack_00000048;
            }
          }
          else {
            ffpmsg((char *)0x1dfb18);
            ffclos(in_stack_fffffffffffff988,
                   (int *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
            local_4 = *in_stack_00000048;
          }
        }
        else {
          ffpmsg((char *)0x1dfac6);
          local_4 = *in_stack_00000048;
        }
      }
      else {
        ffpmsg((char *)0x1dfa2d);
        *in_stack_00000048 = 0x7d;
        local_4 = 0x7d;
      }
    }
    else {
      ffpmsg((char *)0x1de53e);
      *in_stack_00000048 = 0x140;
      local_4 = 0x140;
    }
  }
  else {
    local_4 = *in_stack_00000048;
  }
  return local_4;
}

Assistant:

int ffhist(fitsfile **fptr,  /* IO - pointer to table with X and Y cols;    */
                             /*     on output, points to histogram image    */
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    int ii, datatype, repeat, imin, imax, ibin, bitpix, tstatus, use_datamax = 0;
    long haxes[4];
    fitsfile *histptr;
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD], card[FLEN_CARD];
    tcolumn *colptr;
    iteratorCol imagepars[1];
    int n_cols = 1, nkeys;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    histType histData;    /* Structure holding histogram info for iterator */
    
    double amin[4], amax[4], binsize[4], maxbin[4];
    double datamin = DOUBLENULLVALUE, datamax = DOUBLENULLVALUE;
    char svalue[FLEN_VALUE];
    double dvalue;
    char cpref[4][FLEN_VALUE];
    char *cptr;

    if (*status > 0)
        return(*status);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((*fptr)->HDUposition != ((*fptr)->Fptr)->curhdu)
        ffmahd(*fptr, ((*fptr)->HDUposition) + 1, NULL, status);

    histData.tblptr     = *fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else
        return(*status = BAD_DATATYPE);

    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    tstatus = 0;
    ffgky(*fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    for (ii = 0; ii < naxis; ii++)
    {

      /* get the min, max, and binsize values from keywords, if specified */

      if (*minname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (*maxname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (*binname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      if (*colname[ii] == '\0')
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      if (ffgcno(*fptr, CASEINSEN, colname[ii], histData.hcolnum+ii, status)
              > 0)
      {
        strcpy(errmsg, "column for histogram axis doesn't exist: ");
        strncat(errmsg, colname[ii], FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status);
      }

      colptr = ((*fptr)->Fptr)->tableptr;
      colptr += (histData.hcolnum[ii] - 1);

      repeat = (int) colptr->trepeat;  /* vector repeat factor of the column */
      if (repeat > 1)
      {
        strcpy(errmsg, "Can't bin a vector column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* get the datatype of the column */
      fits_get_eqcoltype(*fptr, histData.hcolnum[ii], &datatype,
         NULL, NULL, status);

      if (datatype < 0 || datatype == TSTRING)
      {
        strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* use TLMINn and TLMAXn keyword values if min and max were not given */
      /* else use actual data min and max if TLMINn and TLMAXn don't exist */
 
      if (minin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMIN", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      }
      else
      {
        amin[ii] = (double) minin[ii];
      }

      if (maxin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMAX", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */
      }
      else
      {
        amax[ii] = (double) maxin[ii];
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] == DOUBLENULLVALUE)
      {
         tstatus = 0;
         ffkeyn("TDBIN", histData.hcolnum[ii], keyname, &tstatus);

         if (ffgky(*fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus) > 0)
         {
	    /* make at least 10 bins */
            binsizein[ii] = (amax[ii] - amin[ii]) / 10. ;
            if (binsizein[ii] > 1.)
                binsizein[ii] = 1.;  /* use default bin size */
         }
      }

      if ( (amin[ii] > amax[ii] && binsizein[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsizein[ii] < 0. ) )
          binsize[ii] = (double) -binsizein[ii];  /* reverse the sign of binsize */
      else
          binsize[ii] =  (double) binsizein[ii];  /* binsize has the correct sign */

      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
 	                       (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        maxbin[ii] = (double) (haxes[ii] + 1.);  /* add 1. instead of .5 to avoid roundoff */

        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii]; 
        haxes[ii] = (long) (maxbin[ii] + 1);
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii];
        haxes[ii] = (long) maxbin[ii];

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

       /* get the histogramming weighting factor */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (ffgky(*fptr, TDOUBLE, wtcol, &histData.weight, NULL, status) )
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(*fptr, CASEINSEN, wtcol, &histData.wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
               return(*status);
            }

            histData.weight = DOUBLENULLVALUE;
        }
    }
    else
        histData.weight = (double) weightin;

    if (histData.weight <= 0. && histData.weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        return(*status = URL_PARSE_ERROR);
    }

    if (recip && histData.weight != DOUBLENULLVALUE)
       /* take reciprocal of weight */
       histData.weight = (double) (1.0 / histData.weight);

    histData.wtrecip = recip;
        
    /* size of histogram is now known, so create temp output file */
    if (ffinit(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
        return(*status);
    }

    if (ffcrim(histptr, bitpix, histData.haxis, haxes, status) > 0)
    {
        ffpmsg("failed to create primary array histogram in temp file");
        ffclos(histptr, status);
        return(*status);
    }

    /* copy all non-structural keywords from the table to the image */
    fits_get_hdrspace(*fptr, &nkeys, NULL, status);
    for (ii = 1; ii <= nkeys; ii++)
    {
       fits_read_record(*fptr, ii, card, status);
       if (fits_get_keyclass(card) >= 120)
           fits_write_record(histptr, card, status);
    }           

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.amin1 = amin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = binsize[0];
    histData.haxis1 = haxes[0];

    if (histData.haxis > 1)
    {
      histData.amin2 = amin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = binsize[1];
      histData.haxis2 = haxes[1];

      if (histData.haxis > 2)
      {
        histData.amin3 = amin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = binsize[2];
        histData.haxis3 = haxes[2];

        if (histData.haxis > 3)
        {
          histData.amin4 = amin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = binsize[3];
          histData.haxis4 = haxes[3];
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    if (fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status) )
         return(*status);

    /* write the World Coordinate System (WCS) keywords */
    /* create default values if WCS keywords are not present in the table */
    for (ii = 0; ii < histData.haxis; ii++)
    {
     /*  CTYPEn  */
       tstatus = 0;
       ffkeyn("TCTYP", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {               /* just use column name as the type */
          tstatus = 0;
          ffkeyn("TTYPE", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
       }
       else
          tstatus = 0;

     /*  CUNITn  */
       ffkeyn("TCUNI", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {         /* use the column units */
          tstatus = 0;
          ffkeyn("TUNIT", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
       }
       else
         tstatus = 0;

     /*  CRPIXn  - Reference Pixel  */
       ffkeyn("TCRPX", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0; /* choose first pixel in new image as ref. pix. */
         tstatus = 0;
       }
       else
       {
           /* calculate locate of the ref. pix. in the new image */
           dvalue = (dvalue - amin[ii]) / binsize[ii] + .5;
       }

       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

     /*  CRVALn - Value at the location of the reference pixel */
       ffkeyn("TCRVL", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         /* calculate value at ref. pix. location (at center of 1st pixel) */
         dvalue = amin[ii] + binsize[ii]/2.;
         tstatus = 0;
       }

       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

     /*  CDELTn - unit size of pixels  */
       ffkeyn("TCDLT", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0;  /* use default pixel size */
         tstatus = 0;
       }

       dvalue = dvalue * binsize[ii];
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

     /*  CROTAn - Rotation angle (degrees CCW)  */
     /*  There should only be a CROTA2 keyword, and only for 2+ D images */
       if (ii == 1)
       {
         ffkeyn("TCROT", histData.hcolnum[ii], keyname, &tstatus);
         ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
         if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
         {
           ffkeyn("CROTA", ii + 1, keyname, &tstatus);
           ffpky(histptr, TDOUBLE, keyname, &dvalue,
                 "Rotation angle", &tstatus);
         }
         else
         {
            /* didn't find CROTA for the 2nd axis, so look for one */
            /* on the first axis */
           tstatus = 0;
           ffkeyn("TCROT", histData.hcolnum[0], keyname, &tstatus);
           ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
           if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
           {
             dvalue *= -1.;   /* negate the value, because mirror image */
             ffkeyn("CROTA", ii + 1, keyname, &tstatus);
             ffpky(histptr, TDOUBLE, keyname, &dvalue,
                   "Rotation angle", &tstatus);
           }
         }
       }
    }

    /* convert any TPn_k keywords to PCi_j; the value remains unchanged */
    /* also convert any TCn_k to CDi_j; the value is modified by n binning size */
    /* This is a bit of a kludge, and only works for 2D WCS */

    if (histData.haxis == 2) {

      /* PC1_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_1", &dvalue, card, &tstatus);

      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[0];
         ffpky(histptr, TDOUBLE, "CD1_1", &dvalue, card, &tstatus);
      }

      /* PC1_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_2", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
        dvalue *=  binsize[0];
        ffpky(histptr, TDOUBLE, "CD1_2", &dvalue, card, &tstatus);
      }
       
      /* PC2_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_1", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_1", &dvalue, card, &tstatus);
      }
       
       /* PC2_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_2", &dvalue, card, &tstatus);
        
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_2", &dvalue, card, &tstatus);
      }
    }   
       
    /* finally, close the original file and return ptr to the new image */
    ffclos(*fptr, status);
    *fptr = histptr;

    return(*status);
}